

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agg_vcgen_stroke.cpp
# Opt level: O0

uint __thiscall agg::vcgen_stroke::vertex(vcgen_stroke *this,double *x,double *y)

{
  double dVar1;
  bool bVar2;
  uint uVar3;
  uint uVar4;
  vertex_dist *pvVar5;
  vertex_dist *pvVar6;
  vertex_dist *pvVar7;
  vertex_dist *pvVar8;
  point_base<double> *ppVar9;
  status_e sVar10;
  point_d *c;
  uint cmd;
  double *y_local;
  double *x_local;
  vcgen_stroke *this_local;
  
  c._4_4_ = 2;
  do {
    bVar2 = is_stop(c._4_4_);
    if (((bVar2 ^ 0xffU) & 1) == 0) {
      return c._4_4_;
    }
    switch(this->m_status) {
    case initial:
      rewind(this,(FILE *)0x0);
    case ready:
      uVar3 = pod_bvector<agg::vertex_dist,_6U>::size
                        (&(this->m_src_vertices).super_pod_bvector<agg::vertex_dist,_6U>);
      if (uVar3 < (this->m_closed != 0) + 2) {
        c._4_4_ = 0;
      }
      else {
        sVar10 = cap1;
        if (this->m_closed != 0) {
          sVar10 = outline1;
        }
        this->m_status = sVar10;
        c._4_4_ = 1;
        this->m_src_vertex = 0;
        this->m_out_vertex = 0;
      }
      break;
    case cap1:
      pvVar5 = pod_bvector<agg::vertex_dist,_6U>::operator[]
                         (&(this->m_src_vertices).super_pod_bvector<agg::vertex_dist,_6U>,0);
      pvVar6 = pod_bvector<agg::vertex_dist,_6U>::operator[]
                         (&(this->m_src_vertices).super_pod_bvector<agg::vertex_dist,_6U>,1);
      pvVar7 = pod_bvector<agg::vertex_dist,_6U>::operator[]
                         (&(this->m_src_vertices).super_pod_bvector<agg::vertex_dist,_6U>,0);
      math_stroke<agg::pod_bvector<agg::point_base<double>,_6U>_>::calc_cap
                (&this->m_stroker,&this->m_out_vertices,pvVar5,pvVar6,pvVar7->dist);
      this->m_src_vertex = 1;
      this->m_prev_status = outline1;
      this->m_status = out_vertices;
      this->m_out_vertex = 0;
      break;
    case cap2:
      uVar3 = pod_bvector<agg::vertex_dist,_6U>::size
                        (&(this->m_src_vertices).super_pod_bvector<agg::vertex_dist,_6U>);
      pvVar5 = pod_bvector<agg::vertex_dist,_6U>::operator[]
                         (&(this->m_src_vertices).super_pod_bvector<agg::vertex_dist,_6U>,uVar3 - 1)
      ;
      uVar3 = pod_bvector<agg::vertex_dist,_6U>::size
                        (&(this->m_src_vertices).super_pod_bvector<agg::vertex_dist,_6U>);
      pvVar6 = pod_bvector<agg::vertex_dist,_6U>::operator[]
                         (&(this->m_src_vertices).super_pod_bvector<agg::vertex_dist,_6U>,uVar3 - 2)
      ;
      uVar3 = pod_bvector<agg::vertex_dist,_6U>::size
                        (&(this->m_src_vertices).super_pod_bvector<agg::vertex_dist,_6U>);
      pvVar7 = pod_bvector<agg::vertex_dist,_6U>::operator[]
                         (&(this->m_src_vertices).super_pod_bvector<agg::vertex_dist,_6U>,uVar3 - 2)
      ;
      math_stroke<agg::pod_bvector<agg::point_base<double>,_6U>_>::calc_cap
                (&this->m_stroker,&this->m_out_vertices,pvVar5,pvVar6,pvVar7->dist);
      this->m_prev_status = outline2;
      this->m_status = out_vertices;
      this->m_out_vertex = 0;
      break;
    case outline1:
      if (this->m_closed == 0) {
        uVar3 = this->m_src_vertex;
        uVar4 = pod_bvector<agg::vertex_dist,_6U>::size
                          (&(this->m_src_vertices).super_pod_bvector<agg::vertex_dist,_6U>);
        if (uVar4 - 1 <= uVar3) {
          this->m_status = cap2;
          break;
        }
      }
      else {
        uVar3 = this->m_src_vertex;
        uVar4 = pod_bvector<agg::vertex_dist,_6U>::size
                          (&(this->m_src_vertices).super_pod_bvector<agg::vertex_dist,_6U>);
        if (uVar4 <= uVar3) {
          this->m_prev_status = close_first;
          this->m_status = end_poly1;
          break;
        }
      }
      pvVar5 = pod_bvector<agg::vertex_dist,_6U>::prev
                         (&(this->m_src_vertices).super_pod_bvector<agg::vertex_dist,_6U>,
                          this->m_src_vertex);
      pvVar6 = pod_bvector<agg::vertex_dist,_6U>::curr
                         (&(this->m_src_vertices).super_pod_bvector<agg::vertex_dist,_6U>,
                          this->m_src_vertex);
      pvVar7 = pod_bvector<agg::vertex_dist,_6U>::next
                         (&(this->m_src_vertices).super_pod_bvector<agg::vertex_dist,_6U>,
                          this->m_src_vertex);
      pvVar8 = pod_bvector<agg::vertex_dist,_6U>::prev
                         (&(this->m_src_vertices).super_pod_bvector<agg::vertex_dist,_6U>,
                          this->m_src_vertex);
      dVar1 = pvVar8->dist;
      pvVar8 = pod_bvector<agg::vertex_dist,_6U>::curr
                         (&(this->m_src_vertices).super_pod_bvector<agg::vertex_dist,_6U>,
                          this->m_src_vertex);
      math_stroke<agg::pod_bvector<agg::point_base<double>,_6U>_>::calc_join
                (&this->m_stroker,&this->m_out_vertices,pvVar5,pvVar6,pvVar7,dVar1,pvVar8->dist);
      this->m_src_vertex = this->m_src_vertex + 1;
      this->m_prev_status = this->m_status;
      this->m_status = out_vertices;
      this->m_out_vertex = 0;
      break;
    case close_first:
      this->m_status = outline2;
      c._4_4_ = 1;
    case outline2:
      if ((uint)(this->m_closed == 0) < this->m_src_vertex) {
        this->m_src_vertex = this->m_src_vertex - 1;
        pvVar5 = pod_bvector<agg::vertex_dist,_6U>::next
                           (&(this->m_src_vertices).super_pod_bvector<agg::vertex_dist,_6U>,
                            this->m_src_vertex);
        pvVar6 = pod_bvector<agg::vertex_dist,_6U>::curr
                           (&(this->m_src_vertices).super_pod_bvector<agg::vertex_dist,_6U>,
                            this->m_src_vertex);
        pvVar7 = pod_bvector<agg::vertex_dist,_6U>::prev
                           (&(this->m_src_vertices).super_pod_bvector<agg::vertex_dist,_6U>,
                            this->m_src_vertex);
        pvVar8 = pod_bvector<agg::vertex_dist,_6U>::curr
                           (&(this->m_src_vertices).super_pod_bvector<agg::vertex_dist,_6U>,
                            this->m_src_vertex);
        dVar1 = pvVar8->dist;
        pvVar8 = pod_bvector<agg::vertex_dist,_6U>::prev
                           (&(this->m_src_vertices).super_pod_bvector<agg::vertex_dist,_6U>,
                            this->m_src_vertex);
        math_stroke<agg::pod_bvector<agg::point_base<double>,_6U>_>::calc_join
                  (&this->m_stroker,&this->m_out_vertices,pvVar5,pvVar6,pvVar7,dVar1,pvVar8->dist);
        this->m_prev_status = this->m_status;
        this->m_status = out_vertices;
        this->m_out_vertex = 0;
      }
      else {
        this->m_status = end_poly2;
        this->m_prev_status = stop;
      }
      break;
    case out_vertices:
      uVar3 = this->m_out_vertex;
      uVar4 = pod_bvector<agg::point_base<double>,_6U>::size(&this->m_out_vertices);
      if (uVar3 < uVar4) {
        uVar3 = this->m_out_vertex;
        this->m_out_vertex = uVar3 + 1;
        ppVar9 = pod_bvector<agg::point_base<double>,_6U>::operator[](&this->m_out_vertices,uVar3);
        *x = ppVar9->x;
        *y = ppVar9->y;
        return c._4_4_;
      }
      this->m_status = this->m_prev_status;
      break;
    case end_poly1:
      this->m_status = this->m_prev_status;
      return 0x5f;
    case end_poly2:
      this->m_status = this->m_prev_status;
      return 0x6f;
    case stop:
      c._4_4_ = 0;
    }
  } while( true );
}

Assistant:

unsigned vcgen_stroke::vertex(double* x, double* y)
    {
        unsigned cmd = path_cmd_line_to;
        while(!is_stop(cmd))
        {
            switch(m_status)
            {
            case initial:
                rewind(0);

            case ready:
                if(m_src_vertices.size() < 2 + unsigned(m_closed != 0))
                {
                    cmd = path_cmd_stop;
                    break;
                }
                m_status = m_closed ? outline1 : cap1;
                cmd = path_cmd_move_to;
                m_src_vertex = 0;
                m_out_vertex = 0;
                break;

            case cap1:
                m_stroker.calc_cap(m_out_vertices,
                                   m_src_vertices[0], 
                                   m_src_vertices[1], 
                                   m_src_vertices[0].dist);
                m_src_vertex = 1;
                m_prev_status = outline1;
                m_status = out_vertices;
                m_out_vertex = 0;
                break;

            case cap2:
                m_stroker.calc_cap(m_out_vertices,
                                   m_src_vertices[m_src_vertices.size() - 1], 
                                   m_src_vertices[m_src_vertices.size() - 2], 
                                   m_src_vertices[m_src_vertices.size() - 2].dist);
                m_prev_status = outline2;
                m_status = out_vertices;
                m_out_vertex = 0;
                break;

            case outline1:
                if(m_closed)
                {
                    if(m_src_vertex >= m_src_vertices.size())
                    {
                        m_prev_status = close_first;
                        m_status = end_poly1;
                        break;
                    }
                }
                else
                {
                    if(m_src_vertex >= m_src_vertices.size() - 1)
                    {
                        m_status = cap2;
                        break;
                    }
                }
                m_stroker.calc_join(m_out_vertices, 
                                    m_src_vertices.prev(m_src_vertex), 
                                    m_src_vertices.curr(m_src_vertex), 
                                    m_src_vertices.next(m_src_vertex), 
                                    m_src_vertices.prev(m_src_vertex).dist,
                                    m_src_vertices.curr(m_src_vertex).dist);
                ++m_src_vertex;
                m_prev_status = m_status;
                m_status = out_vertices;
                m_out_vertex = 0;
                break;

            case close_first:
                m_status = outline2;
                cmd = path_cmd_move_to;

            case outline2:
                if(m_src_vertex <= unsigned(m_closed == 0))
                {
                    m_status = end_poly2;
                    m_prev_status = stop;
                    break;
                }

                --m_src_vertex;
                m_stroker.calc_join(m_out_vertices,
                                    m_src_vertices.next(m_src_vertex), 
                                    m_src_vertices.curr(m_src_vertex), 
                                    m_src_vertices.prev(m_src_vertex), 
                                    m_src_vertices.curr(m_src_vertex).dist, 
                                    m_src_vertices.prev(m_src_vertex).dist);

                m_prev_status = m_status;
                m_status = out_vertices;
                m_out_vertex = 0;
                break;

            case out_vertices:
                if(m_out_vertex >= m_out_vertices.size())
                {
                    m_status = m_prev_status;
                }
                else
                {
                    const point_d& c = m_out_vertices[m_out_vertex++];
                    *x = c.x;
                    *y = c.y;
                    return cmd;
                }
                break;

            case end_poly1:
                m_status = m_prev_status;
                return path_cmd_end_poly | path_flags_close | path_flags_ccw;

            case end_poly2:
                m_status = m_prev_status;
                return path_cmd_end_poly | path_flags_close | path_flags_cw;

            case stop:
                cmd = path_cmd_stop;
                break;
            }
        }
        return cmd;
    }